

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<kj::CappedArray<char,3ul>&>
          (String *__return_storage_ptr__,kj *this,CappedArray<char,_3UL> *params)

{
  CappedArray<char,_3UL> *value;
  ArrayPtr<const_char> local_28;
  kj *local_18;
  CappedArray<char,_3UL> *params_local;
  
  local_18 = this;
  params_local = (CappedArray<char,_3UL> *)__return_storage_ptr__;
  value = fwd<kj::CappedArray<char,3ul>&>((CappedArray<char,_3UL> *)this);
  local_28 = toCharSequence<kj::CappedArray<char,3ul>&>(value);
  _::concat<kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_28,(ArrayPtr<const_char> *)local_28.size_);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}